

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::~BasicResult
          (BasicResult<Catch::clara::detail::ParseState> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00183768;
  pcVar2 = (this->m_errorMessage)._M_dataplus._M_p;
  paVar1 = &(this->m_errorMessage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__ResultValueBase_001837c0;
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type == Ok)
  {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              (&(this->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.m_value.
                m_remainingTokens.m_tokenBuffer);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }